

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
WSNTopologyBasedEnergy::SelectServalNode
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,WSNTopologyBasedEnergy *this)

{
  WSNNode *this_00;
  int iVar1;
  time_t tVar2;
  int iVar3;
  WSNTopologyBasedEnergy *pWVar4;
  int *piVar5;
  bool bVar6;
  allocator<char> local_131;
  vector<int,_std::allocator<int>_> *local_130;
  int local_124;
  _InputArray local_120;
  int local_108 [8];
  undefined1 local_e8 [96];
  WSNNode local_88;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = __return_storage_ptr__;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  iVar3 = -1;
  if (-1 < iVar1 % 9) {
    iVar3 = iVar1 % 9;
  }
  iVar3 = iVar3 + 1;
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    local_108[0] = rand();
    local_108[0] = local_108[0] % 99;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_130,local_108);
  }
  this_00 = (WSNNode *)(local_e8 + 0x28);
  local_124 = 0;
  while (local_124 != 5) {
    for (piVar5 = (local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 != (local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
      WSNNode::WSNNode(&local_88,this->node + *piVar5);
      pWVar4 = (WSNTopologyBasedEnergy *)local_e8;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_e8);
      local_e8._0_8_ = 0x406fe00000000000;
      local_e8._8_8_ = 0x406fe00000000000;
      local_e8._16_8_ = 0x406fe00000000000;
      local_e8._24_8_ = 0;
      drawCrossNode(pWVar4,&this->img,&local_88,(Scalar *)local_e8);
      WSNNode::~WSNNode(&local_88);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"WSN",&local_131);
    local_120.sz.width = 0;
    local_120.sz.height = 0;
    local_120.flags = 0x1010000;
    local_120.obj = this;
    cv::imshow((string *)local_108,&local_120);
    std::__cxx11::string::~string((string *)local_108);
    if (this->Test == true) {
      cv::waitKey(0x46);
    }
    for (piVar5 = (local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 != (local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
      WSNNode::WSNNode(this_00,this->node + *piVar5);
      pWVar4 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
      WSNNode::NodeColor((Scalar *)&stack0xffffffffffffffb0,this->node + *piVar5);
      drawCrossNode(pWVar4,&this->img,this_00,(Scalar *)&stack0xffffffffffffffb0);
      WSNNode::~WSNNode(this_00);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"WSN",&local_131);
    local_120.sz.width = 0;
    local_120.sz.height = 0;
    local_120.flags = 0x1010000;
    local_120.obj = this;
    cv::imshow((string *)local_108,&local_120);
    iVar3 = local_124;
    std::__cxx11::string::~string((string *)local_108);
    if (this->Test == true) {
      cv::waitKey(0x46);
    }
    local_124 = iVar3 + 1;
  }
  return local_130;
}

Assistant:

vector<int> WSNTopologyBasedEnergy::SelectServalNode()
{
	vector<int> SelectNodeSeq;
	vector<int>::iterator it;

	srand((int)time(0));
	int SelectNodeNum=rand()%9+1;
	for(int i=0;i<SelectNodeNum;i++)
	{
		SelectNodeSeq.push_back(rand()%99);
	}

	//闪烁表示发送信号
	for(int i=0;i<LayerNum;i++)
	{
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],Scalar(255,255,255));
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
		for(it=SelectNodeSeq.begin();it!=SelectNodeSeq.end();it++)
		{
			drawCrossNode(img,node[*it],node[*it].NodeColor());	
		}
		cv::imshow("WSN",img);
		if(true==Test) waitKey(70);
	}
	return SelectNodeSeq;
}